

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

ScalarFunction * duckdb::ConcatOperatorFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  FunctionNullHandling in_stack_ffffffffffffff30;
  allocator_type local_ca;
  allocator local_c9;
  code *bind_lambda;
  LogicalType local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  LogicalType local_78;
  LogicalType local_60 [2];
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"||",&local_c9);
  LogicalType::LogicalType(local_60,ANY);
  LogicalType::LogicalType(local_60 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,__l,&local_ca);
  LogicalType::LogicalType(&local_a8,ANY);
  bind_lambda = ConcatFunction;
  LogicalType::LogicalType(&local_78,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_78;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff24;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_90,&local_a8,
             (scalar_function_t *)&stack0xffffffffffffff38,BindConcatOperator,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff30,bind_lambda);
  LogicalType::~LogicalType(&local_78);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff38);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_60[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

ScalarFunction ConcatOperatorFun::GetFunction() {
	ScalarFunction concat_op = ScalarFunction("||", {LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY,
	                                          ConcatFunction, BindConcatOperator);
	return concat_op;
}